

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filenames.cc
# Opt level: O0

string_view __thiscall wabt::GetExtension(wabt *this,string_view filename)

{
  size_type __pos;
  string_view sVar1;
  size_t pos;
  string_view filename_local;
  char *local_10;
  
  filename_local._M_len = filename._M_len;
  pos = (size_t)this;
  __pos = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                    ((basic_string_view<char,_std::char_traits<char>_> *)&pos,'.',0xffffffffffffffff
                    );
  if (__pos == 0xffffffffffffffff) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&filename_local._M_str,"");
  }
  else {
    join_0x00000010_0x00000000_ =
         std::basic_string_view<char,_std::char_traits<char>_>::substr
                   ((basic_string_view<char,_std::char_traits<char>_> *)&pos,__pos,
                    0xffffffffffffffff);
  }
  sVar1._M_len = (size_t)filename_local._M_str;
  sVar1._M_str = local_10;
  return sVar1;
}

Assistant:

std::string_view GetExtension(std::string_view filename) {
  size_t pos = filename.find_last_of('.');
  if (pos == std::string_view::npos) {
    return "";
  }
  return filename.substr(pos);
}